

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O3

aom_codec_err_t
av1_set_reference_dec(AV1_COMMON *cm,int idx,int use_external_ref,YV12_BUFFER_CONFIG *sd)

{
  YV12_BUFFER_CONFIG *dst_bc;
  RefCntBuffer *pRVar1;
  uint8_t *puVar2;
  int iVar3;
  
  if ((7 < (uint)idx) || (pRVar1 = cm->ref_frame_map[(uint)idx], pRVar1 == (RefCntBuffer *)0x0)) {
    aom_internal_error(cm->error,AOM_CODEC_ERROR,"No reference frame");
    return AOM_CODEC_ERROR;
  }
  dst_bc = &pRVar1->buf;
  if (use_external_ref == 0) {
    if (((((pRVar1->buf).field_1.field_0.y_height == (sd->field_1).field_0.y_height) &&
         ((dst_bc->field_0).field_0.y_width == (sd->field_0).field_0.y_width)) &&
        ((pRVar1->buf).field_1.field_0.uv_height == (sd->field_1).field_0.uv_height)) &&
       ((pRVar1->buf).field_0.field_0.uv_width == (sd->field_0).field_0.uv_width)) {
      aom_yv12_copy_frame_c(sd,dst_bc,(uint)(cm->seq_params->monochrome == '\0') * 2 + 1);
      goto LAB_001796a3;
    }
  }
  else {
    iVar3 = equal_dimensions_and_border(dst_bc,sd);
    if (iVar3 != 0) {
      puVar2 = (pRVar1->buf).field_5.field_0.u_buffer;
      (pRVar1->buf).store_buf_adr[0] = (pRVar1->buf).field_5.field_0.y_buffer;
      (pRVar1->buf).store_buf_adr[1] = puVar2;
      (pRVar1->buf).store_buf_adr[2] = (pRVar1->buf).field_5.field_0.v_buffer;
      (pRVar1->buf).field_5.field_0.y_buffer = (sd->field_5).field_0.y_buffer;
      (pRVar1->buf).field_5.field_0.u_buffer = (sd->field_5).field_0.u_buffer;
      (pRVar1->buf).field_5.field_0.v_buffer = (sd->field_5).field_0.v_buffer;
      (pRVar1->buf).use_external_reference_buffers = 1;
      goto LAB_001796a3;
    }
  }
  aom_internal_error(cm->error,AOM_CODEC_ERROR,"Incorrect buffer dimensions");
LAB_001796a3:
  return cm->error->error_code;
}

Assistant:

aom_codec_err_t av1_set_reference_dec(AV1_COMMON *cm, int idx,
                                      int use_external_ref,
                                      YV12_BUFFER_CONFIG *sd) {
  const int num_planes = av1_num_planes(cm);
  YV12_BUFFER_CONFIG *ref_buf = NULL;

  // Get the destination reference buffer.
  ref_buf = get_ref_frame(cm, idx);

  if (ref_buf == NULL) {
    aom_internal_error(cm->error, AOM_CODEC_ERROR, "No reference frame");
    return AOM_CODEC_ERROR;
  }

  if (!use_external_ref) {
    if (!equal_dimensions(ref_buf, sd)) {
      aom_internal_error(cm->error, AOM_CODEC_ERROR,
                         "Incorrect buffer dimensions");
    } else {
      // Overwrite the reference frame buffer.
      aom_yv12_copy_frame(sd, ref_buf, num_planes);
    }
  } else {
    if (!equal_dimensions_and_border(ref_buf, sd)) {
      aom_internal_error(cm->error, AOM_CODEC_ERROR,
                         "Incorrect buffer dimensions");
    } else {
      // Overwrite the reference frame buffer pointers.
      // Once we no longer need the external reference buffer, these pointers
      // are restored.
      ref_buf->store_buf_adr[0] = ref_buf->y_buffer;
      ref_buf->store_buf_adr[1] = ref_buf->u_buffer;
      ref_buf->store_buf_adr[2] = ref_buf->v_buffer;
      ref_buf->y_buffer = sd->y_buffer;
      ref_buf->u_buffer = sd->u_buffer;
      ref_buf->v_buffer = sd->v_buffer;
      ref_buf->use_external_reference_buffers = 1;
    }
  }

  return cm->error->error_code;
}